

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O0

string * SkeletalMesh::Scene::testAllSuffix(string *__return_storage_ptr__,string *no_suffix_name)

{
  char *__filename;
  FILE *__stream;
  string *local_128;
  FILE *ftest;
  allocator<char> local_a6;
  allocator<char> local_a5;
  int i;
  allocator<char> local_91;
  string *local_90;
  string local_88 [8];
  string support_suffix [3];
  int support_suffix_num;
  string *no_suffix_name_local;
  string *try_filename;
  
  local_90 = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,".obj",&local_91);
  local_90 = (string *)(support_suffix[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(support_suffix[0].field_2._M_local_buf + 8),".dae",&local_a5);
  local_90 = (string *)(support_suffix[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(support_suffix[1].field_2._M_local_buf + 8),".fbx",&local_a6);
  std::allocator<char>::~allocator(&local_a6);
  std::allocator<char>::~allocator(&local_a5);
  std::allocator<char>::~allocator(&local_91);
  ftest._4_4_ = 0;
  do {
    if (2 < ftest._4_4_) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
LAB_001375c4:
      local_128 = (string *)(support_suffix[2].field_2._M_local_buf + 8);
      do {
        local_128 = local_128 + -0x20;
        std::__cxx11::string::~string(local_128);
      } while (local_128 != local_88);
      return __return_storage_ptr__;
    }
    std::operator+(__return_storage_ptr__,no_suffix_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&support_suffix[(long)ftest._4_4_ + -1].field_2 + 8));
    __filename = (char *)std::__cxx11::string::c_str();
    __stream = fopen(__filename,"r");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      goto LAB_001375c4;
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    ftest._4_4_ = ftest._4_4_ + 1;
  } while( true );
}

Assistant:

static std::string testAllSuffix(std::string no_suffix_name) {
            const int support_suffix_num = 3;
            const std::string support_suffix[support_suffix_num] = {
                    ".obj",
                    ".dae",
                    ".fbx"
            };

            for (int i = 0; i < support_suffix_num; i++) {
                std::string try_filename = no_suffix_name + support_suffix[i];
                FILE *ftest = fopen(try_filename.c_str(), "r");
                if (ftest) {
                    fclose(ftest);
                    return try_filename;
                }
            }
            return std::string();
        }